

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void enterFullscreenMode(_GLFWwindow *window)

{
  long a;
  int ypos;
  int xpos;
  unsigned_long value;
  
  if (_glfw.x11.saver.count == 0) {
    XGetScreenSaver(_glfw.x11.display,0x117a44,0x117a48,0x117a4c,0x117a50);
    XSetScreenSaver(_glfw.x11.display,0,0,0,2);
  }
  _glfw.x11.saver.count = _glfw.x11.saver.count + 1;
  _glfwSetVideoMode(window->monitor,&window->videoMode);
  if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR != 0) {
    value = 1;
    XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20
                    ,0,&value,1);
  }
  _glfwPlatformGetMonitorPos(window->monitor,&xpos,&ypos);
  _glfwPlatformGetVideoMode(window->monitor,(GLFWvidmode *)&value);
  XMoveResizeWindow(_glfw.x11.display,(window->x11).handle,xpos,ypos);
  if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != '\0') {
    a = (long)(window->monitor->x11).index;
    sendEventToWM(window,_glfw.x11.NET_WM_FULLSCREEN_MONITORS,a,a,a,a,CONCAT44(xpos,ypos));
  }
  if (_glfw.x11.NET_ACTIVE_WINDOW == 0) {
    XRaiseWindow(_glfw.x11.display,(window->x11).handle);
    XSetInputFocus(_glfw.x11.display,(window->x11).handle,2,0);
  }
  else {
    sendEventToWM(window,_glfw.x11.NET_ACTIVE_WINDOW,1,0,0,0,CONCAT44(xpos,ypos));
  }
  if (_glfw.x11.NET_WM_STATE_FULLSCREEN != 0 && _glfw.x11.NET_WM_STATE != 0) {
    sendEventToWM(window,_glfw.x11.NET_WM_STATE,1,_glfw.x11.NET_WM_STATE_FULLSCREEN,0,1,
                  CONCAT44(xpos,ypos));
  }
  return;
}

Assistant:

static void enterFullscreenMode(_GLFWwindow* window)
{
    if (_glfw.x11.saver.count == 0)
    {
        // Remember old screen saver settings
        XGetScreenSaver(_glfw.x11.display,
                        &_glfw.x11.saver.timeout,
                        &_glfw.x11.saver.interval,
                        &_glfw.x11.saver.blanking,
                        &_glfw.x11.saver.exposure);

        // Disable screen saver
        XSetScreenSaver(_glfw.x11.display, 0, 0, DontPreferBlanking,
                        DefaultExposures);
    }

    _glfw.x11.saver.count++;

    _glfwSetVideoMode(window->monitor, &window->videoMode);

    if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR)
    {
        const unsigned long value = 1;

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                        PropModeReplace, (unsigned char*) &value, 1);
    }

    // Position the window over its monitor
    {
        int xpos, ypos;
        GLFWvidmode mode;

        _glfwPlatformGetMonitorPos(window->monitor, &xpos, &ypos);
        _glfwPlatformGetVideoMode(window->monitor, &mode);

        XMoveResizeWindow(_glfw.x11.display, window->x11.handle,
                          xpos, ypos, mode.width, mode.height);
    }

    if (_glfw.x11.xinerama.available && _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
    {
        sendEventToWM(window,
                      _glfw.x11.NET_WM_FULLSCREEN_MONITORS,
                      window->monitor->x11.index,
                      window->monitor->x11.index,
                      window->monitor->x11.index,
                      window->monitor->x11.index,
                      0);
    }

    if (_glfw.x11.NET_ACTIVE_WINDOW)
    {
        // Ask the window manager to raise and focus the GLFW window
        // Only focused windows with the _NET_WM_STATE_FULLSCREEN state end up
        // on top of all other windows ("Stacking order" in EWMH spec)
        sendEventToWM(window, _glfw.x11.NET_ACTIVE_WINDOW, 1, 0, 0, 0, 0);
    }
    else
    {
        XRaiseWindow(_glfw.x11.display, window->x11.handle);
        XSetInputFocus(_glfw.x11.display, window->x11.handle,
                       RevertToParent, CurrentTime);
    }

    if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
    {
        // Ask the window manager to make the GLFW window a full screen window
        // Full screen windows are undecorated and, when focused, are kept
        // on top of all other windows
        sendEventToWM(window,
                      _glfw.x11.NET_WM_STATE,
                      _NET_WM_STATE_ADD,
                      _glfw.x11.NET_WM_STATE_FULLSCREEN,
                      0, 1, 0);
    }
}